

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifUtil.c
# Opt level: O0

void If_CutTraverse(If_Man_t *p,If_Obj_t *pRoot,If_Cut_t *pCut,Vec_Ptr_t *vNodes)

{
  int iVar1;
  uint *puVar2;
  bool bVar3;
  int local_34;
  If_Obj_t *pIStack_30;
  int i;
  If_Obj_t *pLeaf;
  Vec_Ptr_t *vNodes_local;
  If_Cut_t *pCut_local;
  If_Obj_t *pRoot_local;
  If_Man_t *p_local;
  
  Vec_PtrClear(vNodes);
  local_34 = 0;
  while( true ) {
    bVar3 = false;
    if (local_34 < (int)(*(uint *)&pCut->field_0x1c >> 0x18)) {
      pIStack_30 = If_ManObj(p,(int)(&pCut[1].Area)[local_34]);
      bVar3 = pIStack_30 != (If_Obj_t *)0x0;
    }
    if (!bVar3) break;
    Vec_PtrPush(vNodes,pIStack_30);
    if ((*(uint *)pIStack_30 >> 8 & 1) != 0) {
      __assert_fail("pLeaf->fMark == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifUtil.c"
                    ,0x23e,"void If_CutTraverse(If_Man_t *, If_Obj_t *, If_Cut_t *, Vec_Ptr_t *)");
    }
    *(uint *)pIStack_30 = *(uint *)pIStack_30 & 0xfffffeff | 0x100;
    local_34 = local_34 + 1;
  }
  If_CutTraverse_rec(pRoot,vNodes);
  for (local_34 = 0; iVar1 = Vec_PtrSize(vNodes), local_34 < iVar1; local_34 = local_34 + 1) {
    puVar2 = (uint *)Vec_PtrEntry(vNodes,local_34);
    *puVar2 = *puVar2 & 0xfffffeff;
  }
  return;
}

Assistant:

void If_CutTraverse( If_Man_t * p, If_Obj_t * pRoot, If_Cut_t * pCut, Vec_Ptr_t * vNodes )
{
    If_Obj_t * pLeaf;
    int i;
    // collect the internal nodes of the cut
    Vec_PtrClear( vNodes );
    If_CutForEachLeaf( p, pCut, pLeaf, i )
    {
        Vec_PtrPush( vNodes, pLeaf );
        assert( pLeaf->fMark == 0 );
        pLeaf->fMark = 1;
    }
    // collect other nodes
    If_CutTraverse_rec( pRoot, vNodes );
    // clean the mark
    Vec_PtrForEachEntry( If_Obj_t *, vNodes, pLeaf, i )
        pLeaf->fMark = 0;
}